

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_rinfo(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  char *__src;
  long in_RDI;
  __type_conflict2 _Var2;
  int i;
  ROOM_INDEX_DATA *location;
  char buf [4608];
  char arg [4608];
  char *in_stack_ffffffffffffdb98;
  char *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  CHAR_DATA *local_2430;
  int local_2424;
  char local_2418 [4608];
  char local_1218;
  long local_8;
  
  local_8 = in_RDI;
  one_argument(in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
  if (local_1218 == '\0') {
    local_2430 = *(CHAR_DATA **)(local_8 + 0xa8);
  }
  else {
    local_2430 = (CHAR_DATA *)find_location(in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0);
  }
  if (local_2430 == (CHAR_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  else {
    sprintf(local_2418,"Room %d flags (%s):\n\r",(ulong)(uint)(int)local_2430->trust,
            local_2430->long_descr);
    pCVar1 = local_2430->pet->defending;
    _Var2 = std::pow<int,int>(0,0x599e7d);
    if (((ulong)pCVar1 & (long)_Var2) != 0) {
      strcat(local_2418,"AREA_EXPLORE\n\r");
    }
    pCVar1 = local_2430->pet->defending;
    _Var2 = std::pow<int,int>(0,0x599ec2);
    if (((ulong)pCVar1 & (long)_Var2) != 0) {
      strcat(local_2418,"AREA_NO_NEWBIES\n\r");
    }
    pCVar1 = local_2430->pet->defending;
    _Var2 = std::pow<int,int>(0,0x599f04);
    if (((ulong)pCVar1 & (long)_Var2) != 0) {
      strcat(local_2418,"AREA_UNGHOST\n\r");
    }
    local_2424 = 0;
    while (room_flags[local_2424].name != (char *)0x0) {
      in_stack_ffffffffffffdbb0 =
           (char *)local_2430->act[(long)(int)(room_flags[local_2424].bit / 0x20) + -8];
      in_stack_ffffffffffffdba8 = local_2430;
      _Var2 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffdba0 >> 0x20),
                                 (long)in_stack_ffffffffffffdb98);
      if (((ulong)in_stack_ffffffffffffdbb0 & (long)_Var2) != 0) {
        strcat(local_2418,"ROOM ");
        in_stack_ffffffffffffdba0 = local_2418;
        __src = upstring(room_flags[local_2424].name);
        strcat(in_stack_ffffffffffffdba0,__src);
        strcat(local_2418,"\n\r");
      }
      local_2424 = local_2424 + 1;
    }
    if ((local_2430 == (CHAR_DATA *)0xfffffffffffffec0) && (lRamfffffffffffffef0 == -0x60)) {
      strcat(local_2418,"(no flags)\n\r");
    }
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  return;
}

Assistant:

void do_rinfo(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	ROOM_INDEX_DATA *location;

	one_argument(argument, arg);

	location = (arg[0] == '\0')
		? ch->in_room
		: find_location(ch, arg);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	sprintf(buf, "Room %d flags (%s):\n\r", location->vnum, location->name);

	if (IS_SET(location->area->area_flags, AREA_EXPLORE))
		strcat(buf, "AREA_EXPLORE\n\r");

	if (IS_SET(location->area->area_flags, AREA_NO_NEWBIES))
		strcat(buf, "AREA_NO_NEWBIES\n\r");

	if (IS_SET(location->area->area_flags, AREA_UNGHOST))
		strcat(buf, "AREA_UNGHOST\n\r");

	for (int i = 0; room_flags[i].name != nullptr; i++)
	{
		if (IS_SET(location->room_flags, room_flags[i].bit))
		{
			strcat(buf, "ROOM ");
			strcat(buf, upstring(room_flags[i].name));
			strcat(buf, "\n\r");
		}
	}

	if (location->room_flags == 0 && location->area->area_flags == 0)
		strcat(buf, "(no flags)\n\r");

	send_to_char(buf, ch);
}